

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_table_set_globalz(size_t len,secp256k1_ge *a,secp256k1_fe *zr)

{
  secp256k1_fe *b;
  long lVar1;
  secp256k1_ge *r;
  secp256k1_fe zs;
  secp256k1_fe zi3;
  secp256k1_fe zi2;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  if (len != 0) {
    secp256k1_fe_impl_normalize_weak(&a[len - 1].y);
    b = zr + (len - 1);
    local_a8.n[4] = zr[len - 1].n[4];
    local_a8.n[0] = b->n[0];
    local_a8.n[1] = zr[len - 1].n[1];
    local_a8.n[2] = zr[len - 1].n[2];
    local_a8.n[3] = zr[len - 1].n[3];
    r = a + (len - 2);
    for (lVar1 = 0; len - 1 != lVar1; lVar1 = lVar1 + 1) {
      if (lVar1 != 0) {
        secp256k1_fe_impl_mul(&local_a8,&local_a8,b);
      }
      secp256k1_fe_impl_sqr(&local_58,&local_a8);
      secp256k1_fe_impl_mul(&local_80,&local_58,&local_a8);
      secp256k1_fe_impl_mul(&r->x,&r->x,&local_58);
      secp256k1_fe_impl_mul(&r->y,&r->y,&local_80);
      b = b + -1;
      r = r + -1;
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_table_set_globalz(size_t len, secp256k1_ge *a, const secp256k1_fe *zr) {
    size_t i;
    secp256k1_fe zs;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
        SECP256K1_FE_VERIFY(&zr[i]);
    }
#endif

    if (len > 0) {
        i = len - 1;
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&a[i].y);
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_ge_zinv(&a[i], &a[i], &zs);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
    }
#endif
}